

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

int __thiscall QProcess::open(QProcess *this,char *__file,int __oflag,...)

{
  bool bVar1;
  QProcessPrivate *file;
  long in_FS_OFFSET;
  QProcessPrivate *unaff_retaddr;
  QProcessPrivate *d;
  OpenMode OStack000000000000005c;
  undefined8 in_stack_00000058;
  char *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  undefined1 local_55;
  QMessageLogger local_50;
  QMessageLogger local_30;
  undefined4 local_c;
  long local_8;
  
  OStack000000000000005c.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = SUB84((ulong)in_stack_00000058 >> 0x20,0);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = SUB84(__file,0);
  file = d_func((QProcess *)0x792919);
  if (file->processState == '\0') {
    bVar1 = QString::isEmpty((QString *)0x79296d);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this,(char *)file,in_stack_ffffffffffffff94,
                 in_stack_ffffffffffffff88);
      QMessageLogger::warning(&local_50,"QProcess::start: program not set");
      local_55 = 0;
    }
    else {
      QProcessPrivate::start(unaff_retaddr,OStack000000000000005c);
      local_55 = 1;
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this,(char *)file,in_stack_ffffffffffffff94,
               in_stack_ffffffffffffff88);
    QMessageLogger::warning(&local_30,"QProcess::start: Process is already running");
    local_55 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_55);
  }
  __stack_chk_fail();
}

Assistant:

bool QProcess::open(OpenMode mode)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::start: Process is already running");
        return false;
    }
    if (d->program.isEmpty()) {
        qWarning("QProcess::start: program not set");
        return false;
    }

    d->start(mode);
    return true;
}